

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffer asio::operator+(mutable_buffer *b,size_t n)

{
  size_t sVar1;
  void *pvVar2;
  size_t local_50;
  size_t new_size;
  char *new_data;
  size_t offset;
  size_t n_local;
  mutable_buffer *b_local;
  
  sVar1 = mutable_buffer::size(b);
  local_50 = n;
  if (sVar1 <= n) {
    local_50 = mutable_buffer::size(b);
  }
  pvVar2 = mutable_buffer::data(b);
  sVar1 = mutable_buffer::size(b);
  mutable_buffer::mutable_buffer
            ((mutable_buffer *)&b_local,(void *)((long)pvVar2 + local_50),sVar1 - local_50);
  return _b_local;
}

Assistant:

inline mutable_buffer operator+(const mutable_buffer& b,
    std::size_t n) ASIO_NOEXCEPT
{
  std::size_t offset = n < b.size() ? n : b.size();
  char* new_data = static_cast<char*>(b.data()) + offset;
  std::size_t new_size = b.size() - offset;
  return mutable_buffer(new_data, new_size
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , b.get_debug_check()
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}